

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

t_symbol * canvas_realizedollar(_glist *x,t_symbol *s)

{
  char *pcVar1;
  _canvasenvironment *p_Var2;
  _canvasenvironment *env;
  char *name;
  t_symbol *ret;
  t_symbol *s_local;
  _glist *x_local;
  
  pcVar1 = strchr(s->s_name,0x24);
  name = (char *)s;
  if (pcVar1 != (char *)0x0) {
    p_Var2 = canvas_getenv(x);
    canvas_setcurrent(x);
    name = (char *)binbuf_realizedollsym(s,p_Var2->ce_argc,p_Var2->ce_argv,1);
    canvas_unsetcurrent(x);
  }
  return (t_symbol *)name;
}

Assistant:

t_symbol *canvas_realizedollar(t_canvas *x, t_symbol *s)
{
    t_symbol *ret;
    const char *name = s->s_name;
    if (strchr(name, '$'))
    {
        t_canvasenvironment *env = canvas_getenv(x);
        canvas_setcurrent(x);
        ret = binbuf_realizedollsym(s, env->ce_argc, env->ce_argv, 1);
        canvas_unsetcurrent(x);
    }
    else ret = s;
    return (ret);
}